

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::allTrueI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  bool bVar1;
  int32_t iVar2;
  Literal *in_RDX;
  long lVar3;
  undefined1 local_1c8 [8];
  LaneArray<16> lanes;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_1c8,(wasm *)this,in_RDX);
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  lVar3 = 0;
  do {
    if (lVar3 + 0x18 == 0x198) {
      iVar2 = 1;
      goto LAB_00c9bb48;
    }
    makeZero((Literal *)__return_storage_ptr___00,
             (Type)*(uintptr_t *)((long)&lanes._M_elems[0].field_0 + lVar3 + 8));
    bVar1 = operator==((Literal *)(local_1c8 + lVar3),(Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar3 = lVar3 + 0x18;
  } while (!bVar1);
  iVar2 = 0;
LAB_00c9bb48:
  (__return_storage_ptr__->field_0).i32 = iVar2;
  (__return_storage_ptr__->type).id = 2;
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1c8);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::allTrueI8x16() const {
  return all_true<16, &Literal::getLanesUI8x16>(*this);
}